

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

If_Man_t * Gia_ManToIf(Gia_Man_t *p,If_Par_t *pPars)

{
  uint uVar1;
  If_Man_t *pIfMan;
  char *pcVar2;
  Gia_Obj_t *pObj;
  ulong uVar3;
  If_Obj_t *pIVar4;
  If_Obj_t *pIVar5;
  Gia_Obj_t *pObj_00;
  ulong uVar6;
  Gia_Obj_t *pGVar7;
  
  Gia_ManChoiceLevel(p);
  if (p->pSibls != (int *)0x0) {
    Gia_ManMarkFanoutDrivers(p);
  }
  pIfMan = If_ManStart(pPars);
  pcVar2 = Abc_UtilStrsav(p->pName);
  pIfMan->pName = pcVar2;
  if (1.0 < (double)pIfMan->nObjBytes * (double)p->nObjs * 9.313225746154785e-10) {
    printf(
          "Warning: The mapper will allocate %.1f GB for to represent the subject graph with %d AIG nodes.\n"
          );
  }
  Gia_ManFillValue(p);
  p->pObjs->Value = pIfMan->pConst1->Id;
  uVar6 = 1;
  do {
    if (((long)p->nObjs <= (long)uVar6) ||
       (pObj = Gia_ManObj(p,(int)uVar6), pObj == (Gia_Obj_t *)0x0)) {
      if (p->pSibls != (int *)0x0) {
        Gia_ManCleanMark0(p);
      }
      return pIfMan;
    }
    uVar1 = (uint)*(ulong *)pObj;
    uVar3 = *(ulong *)pObj & 0x1fffffff;
    if (uVar3 == 0x1fffffff || (int)uVar1 < 0) {
      if ((~uVar1 & 0x9fffffff) == 0) {
        pIVar4 = If_ManCreateCi(pIfMan);
        uVar1 = Gia_ObjLevel(p,pObj);
        *(uint *)pIVar4 = *(uint *)pIVar4 & 0x1fff | uVar1 << 0xd;
        if (pIfMan->nLevelMax < (int)(uVar1 & 0x7ffff)) {
          pIfMan->nLevelMax = uVar1 & 0x7ffff;
        }
      }
      else {
        if ((-1 < (int)uVar1) || ((int)uVar3 == 0x1fffffff)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                        ,0x32b,"If_Man_t *Gia_ManToIf(Gia_Man_t *, If_Par_t *)");
        }
        pIVar4 = If_ManFanin0Copy(pIfMan,pObj);
        pIVar4 = If_ManCreateCo(pIfMan,(If_Obj_t *)
                                       ((ulong)((~*(ulong *)(pObj + -(ulong)((uint)*(undefined8 *)
                                                                                    pObj &
                                                                            0x1fffffff)) &
                                                0x1fffffff1fffffff) == 0) ^ (ulong)pIVar4));
      }
    }
    else {
      pIVar4 = If_ManFanin0Copy(pIfMan,pObj);
      pIVar5 = If_ManObj(pIfMan,pObj[-(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff)].Value);
      pIVar4 = If_ManCreateAnd(pIfMan,pIVar4,
                               (If_Obj_t *)
                               ((ulong)((uint)((ulong)*(undefined8 *)pObj >> 0x3d) & 1) ^
                               (ulong)pIVar5));
    }
    if (uVar6 != (uint)pIVar4->Id) {
      __assert_fail("i == If_ObjId(pIfObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                    ,0x32c,"If_Man_t *Gia_ManToIf(Gia_Man_t *, If_Par_t *)");
    }
    pObj->Value = pIVar4->Id;
    if (((p->pSibls != (int *)0x0) && (p->pSibls[uVar6] != 0)) && ((pObj->field_0x3 & 0x40) != 0)) {
      uVar3 = uVar6 & 0xffffffff;
      pGVar7 = pObj;
      while (pObj_00 = Gia_ObjSiblObj(p,(int)uVar3), pObj_00 != (Gia_Obj_t *)0x0) {
        pIVar4 = If_ManObj(pIfMan,pGVar7->Value);
        pIVar5 = If_ManObj(pIfMan,pObj_00->Value);
        pIVar4->pEquiv = pIVar5;
        uVar1 = Gia_ObjId(p,pObj_00);
        uVar3 = (ulong)uVar1;
        pGVar7 = pObj_00;
      }
      pIVar4 = If_ManObj(pIfMan,pObj->Value);
      If_ManCreateChoice(pIfMan,pIVar4);
      pPars->fExpRed = 0;
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

If_Man_t * Gia_ManToIf( Gia_Man_t * p, If_Par_t * pPars )
{
    If_Man_t * pIfMan;
    If_Obj_t * pIfObj = NULL;
    Gia_Obj_t * pObj;
    int i;
    // create levels with choices
    Gia_ManChoiceLevel( p );
    // mark representative nodes
    if ( Gia_ManHasChoices(p) )
        Gia_ManMarkFanoutDrivers( p );
    // start the mapping manager and set its parameters
    pIfMan = If_ManStart( pPars );
    pIfMan->pName = Abc_UtilStrsav( Gia_ManName(p) );
    // print warning about excessive memory usage
    if ( 1.0 * Gia_ManObjNum(p) * pIfMan->nObjBytes / (1<<30) > 1.0 )
        printf( "Warning: The mapper will allocate %.1f GB for to represent the subject graph with %d AIG nodes.\n", 
            1.0 * Gia_ManObjNum(p) * pIfMan->nObjBytes / (1<<30), Gia_ManObjNum(p) );
    // load the AIG into the mapper
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = If_ObjId( If_ManConst1(pIfMan) );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pIfObj = If_ManCreateAnd( pIfMan, If_ManFanin0Copy(pIfMan, pObj), If_ManFanin1Copy(pIfMan, pObj) );
        else if ( Gia_ObjIsCi(pObj) )
        {
            pIfObj = If_ManCreateCi( pIfMan );
            If_ObjSetLevel( pIfObj, Gia_ObjLevel(p, pObj) );
//            Abc_Print( 1, "pi%d=%d\n ", If_ObjId(pIfObj), If_ObjLevel(pIfObj) );
            if ( pIfMan->nLevelMax < (int)pIfObj->Level )
                pIfMan->nLevelMax = (int)pIfObj->Level;
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            pIfObj = If_ManCreateCo( pIfMan, If_NotCond( If_ManFanin0Copy(pIfMan, pObj), Gia_ObjIsConst0(Gia_ObjFanin0(pObj))) );
//            Abc_Print( 1, "po%d=%d\n ", If_ObjId(pIfObj), If_ObjLevel(pIfObj) );
        }
        else assert( 0 );
        assert( i == If_ObjId(pIfObj) );
        Gia_ObjSetValue( pObj, If_ObjId(pIfObj) );
        // set up the choice node
        if ( Gia_ObjSibl(p, i) && pObj->fMark0 )
        {
            Gia_Obj_t * pSibl, * pPrev;
            for ( pPrev = pObj, pSibl = Gia_ObjSiblObj(p, i); pSibl; pPrev = pSibl, pSibl = Gia_ObjSiblObj(p, Gia_ObjId(p, pSibl)) )
                If_ObjSetChoice( If_ManObj(pIfMan, Gia_ObjValue(pPrev)), If_ManObj(pIfMan, Gia_ObjValue(pSibl)) );
            If_ManCreateChoice( pIfMan, If_ManObj(pIfMan, Gia_ObjValue(pObj)) );
            pPars->fExpRed = 0;
        }
//        assert( If_ObjLevel(pIfObj) == Gia_ObjLevel(pNode) );
    }
    if ( Gia_ManHasChoices(p) )
        Gia_ManCleanMark0( p );
    return pIfMan;
}